

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_helper.c
# Opt level: O2

void riscv_cpu_do_unaligned_access_riscv64
               (CPUState *cs,vaddr addr,MMUAccessType access_type,int mmu_idx,uintptr_t retaddr)

{
  uint32_t exception;
  
  if (access_type < (MMU_INST_FETCH|MMU_DATA_STORE)) {
    exception = *(uint32_t *)(&DAT_00bc49b0 + (ulong)access_type * 4);
    cs->exception_index = exception;
    cs[1].tb_jmp_cache[0x187] = (TranslationBlock *)addr;
    riscv_raise_exception_riscv64
              ((CPURISCVState_conflict2 *)(cs[1].tb_jmp_cache + 0x143),exception,retaddr);
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/riscv/cpu_helper.c"
             ,0x2b3,(char *)0x0);
}

Assistant:

void riscv_cpu_do_unaligned_access(CPUState *cs, vaddr addr,
                                   MMUAccessType access_type, int mmu_idx,
                                   uintptr_t retaddr)
{
    RISCVCPU *cpu = RISCV_CPU(cs);
    CPURISCVState *env = &cpu->env;
    switch (access_type) {
    case MMU_INST_FETCH:
        cs->exception_index = RISCV_EXCP_INST_ADDR_MIS;
        break;
    case MMU_DATA_LOAD:
        cs->exception_index = RISCV_EXCP_LOAD_ADDR_MIS;
        break;
    case MMU_DATA_STORE:
        cs->exception_index = RISCV_EXCP_STORE_AMO_ADDR_MIS;
        break;
    default:
        g_assert_not_reached();
    }
    env->badaddr = addr;
    riscv_raise_exception(env, cs->exception_index, retaddr);
}